

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatticeFactory.hpp
# Opt level: O2

LatticeFactory * OpenMD::LatticeFactory::getInstance(void)

{
  int iVar1;
  
  if ((getInstance()::instance == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getInstance()::instance), iVar1 != 0)) {
    getInstance::instance.creatorMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    getInstance::instance.creatorMap_._M_t._M_impl._0_8_ = 0;
    getInstance::instance.creatorMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
    ;
    getInstance::instance.creatorMap_._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    getInstance::instance.creatorMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &getInstance::instance.creatorMap_._M_t._M_impl.super__Rb_tree_header._M_header;
    getInstance::instance.creatorMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &getInstance::instance.creatorMap_._M_t._M_impl.super__Rb_tree_header._M_header;
    getInstance::instance.creatorMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __cxa_atexit(~LatticeFactory,&getInstance::instance,&__dso_handle);
    __cxa_guard_release(&getInstance()::instance);
  }
  return &getInstance::instance;
}

Assistant:

static LatticeFactory& getInstance() {
      static LatticeFactory instance {};
      return instance;
    }